

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O2

void beagle::cpu::transposeSquareMatrix<float>(float *mat,int size)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  float *pfVar7;
  ulong uVar8;
  
  iVar2 = 1;
  if (1 < size) {
    iVar2 = size;
  }
  uVar3 = (ulong)(uint)size;
  pfVar5 = mat + size;
  pfVar4 = mat + 1;
  for (uVar6 = 0; uVar3 = uVar3 - 1, uVar6 != iVar2 - 1; uVar6 = uVar6 + 1) {
    pfVar7 = pfVar5;
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      fVar1 = pfVar4[uVar8];
      pfVar4[uVar8] = *pfVar7;
      *pfVar7 = fVar1;
      pfVar7 = pfVar7 + size;
    }
    pfVar4 = pfVar4 + (long)size + 1;
    pfVar5 = pfVar5 + (long)size + 1;
  }
  return;
}

Assistant:

void transposeSquareMatrix(REALTYPE* mat,
                           int size) {
    for (int i = 0; i < size - 1; i++) {
        for (int j = i + 1; j < size; j++) {
            REALTYPE tmp = mat[i * size + j];
            mat[i * size + j] = mat[j * size + i];
            mat[j * size + i] = tmp;
        }
    }
}